

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSDPResultData.c
# Opt level: O3

int SSDPResultData_assign(SSDPResultData *p,SSDPResultData *q)

{
  Upnp_FunPtr p_Var1;
  int iVar2;
  int iVar3;
  
  iVar3 = 1;
  if (p != q) {
    iVar2 = SSDPResultData_set_Param(p,q->m_Param);
    if (iVar2 == 0) {
      iVar3 = 0;
    }
    else {
      p_Var1 = q->m_CtrlptCallback;
      p->m_Cookie = q->m_Cookie;
      p->m_CtrlptCallback = p_Var1;
    }
  }
  return iVar3;
}

Assistant:

int SSDPResultData_assign(SSDPResultData *p, const SSDPResultData *q)
{
	int ok = 1;

	if (p != q) {
		ok = ok &&
		     SSDPResultData_set_Param(p, SSDPResultData_get_Param(q));
		ok = ok &&
		     SSDPResultData_set_Cookie(p, SSDPResultData_get_Cookie(q));
		ok = ok && SSDPResultData_set_CtrlptCallback(
				   p, SSDPResultData_get_CtrlptCallback(q));
	}

	return ok;
}